

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void GameLoop::start(void)

{
  __type local_d;
  int local_c [2];
  int gameModeChoice;
  
  do {
    std::operator<<((ostream *)&std::cout,
                    "\nWhich game mode do you want to play? \n 1 - Single game \n 2 - Tournament \n"
                   );
    std::istream::operator>>((istream *)&std::cin,local_c);
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    std::istream::ignore((long)&std::cin,0x200);
    local_d = true;
    if ((0 < local_c[0]) && (local_d = true, local_c[0] < 3)) {
      local_d = std::isnan<int>(local_c[0]);
    }
  } while (local_d != false);
  if (local_c[0] == 1) {
    startSingle(false);
  }
  else if (local_c[0] == 2) {
    startTournament();
  }
  else {
    startSingle(false);
  }
  return;
}

Assistant:

void GameLoop::start() {
    int gameModeChoice;
    do {
        cout << "\nWhich game mode do you want to play? \n 1 - Single game \n 2 - Tournament \n";
        cin >> gameModeChoice;
        cin.clear();
        cin.ignore(512, '\n');
    } while (gameModeChoice < 1 || gameModeChoice > 2 || isnan(gameModeChoice));

    switch (gameModeChoice) {
        case 1:
            startSingle();
            break;
        case 2:
            startTournament();
            break;
        default:
            startSingle();
            break;
    }
}